

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O3

void __thiscall
FDrawInfo::AddUpperMissingTexture(FDrawInfo *this,side_t *side,subsector_t *sub,float Backheight)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  seg_t *psVar4;
  MissingTextureInfo *pMVar5;
  MissingSegInfo *pMVar6;
  int iVar7;
  float *pfVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  if (((*side->segs)->backsector != (sector_t *)0x0) && (iVar7 = side->numsegs, 0 < iVar7)) {
    lVar10 = 0;
    do {
      psVar4 = side->segs[lVar10];
      if (psVar4->Subsector == sub) {
        if (sub->render_sector != sub->sector) {
          return;
        }
        if (psVar4->frontsector != sub->render_sector) {
          return;
        }
        uVar9 = (ulong)(this->MissingUpperTextures).Count;
        if (uVar9 != 0) {
          pfVar8 = &((this->MissingUpperTextures).Array)->Planez;
          uVar11 = 0;
          do {
            if (*(subsector_t **)(pfVar8 + -2) == sub) {
              if (Backheight < *pfVar8) {
                *pfVar8 = Backheight;
                ((MissingTextureInfo *)(pfVar8 + -4))->seg = psVar4;
              }
              TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Grow
                        (&this->MissingUpperSegs,1);
              pMVar6 = (this->MissingUpperSegs).Array;
              uVar2 = (this->MissingUpperSegs).Count;
              pMVar6[uVar2].seg = psVar4;
              pMVar6[uVar2].MTI_Index = (int)uVar11;
              puVar1 = &(this->MissingUpperSegs).Count;
              *puVar1 = *puVar1 + 1;
              return;
            }
            uVar11 = uVar11 + 1;
            pfVar8 = pfVar8 + 6;
          } while (uVar9 != uVar11);
        }
        TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::Grow
                  (&this->MissingUpperTextures,1);
        pMVar5 = (this->MissingUpperTextures).Array;
        uVar2 = (this->MissingUpperTextures).Count;
        pMVar5[uVar2].seg = psVar4;
        pMVar5[uVar2].sub = sub;
        pMVar5[uVar2].Planez = Backheight;
        pMVar5[uVar2].Planezfront = 0.0;
        (this->MissingUpperTextures).Count = uVar2 + 1;
        TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Grow
                  (&this->MissingUpperSegs,1);
        pMVar6 = (this->MissingUpperSegs).Array;
        uVar3 = (this->MissingUpperSegs).Count;
        pMVar6[uVar3].seg = psVar4;
        pMVar6[uVar3].MTI_Index = uVar2;
        puVar1 = &(this->MissingUpperSegs).Count;
        *puVar1 = *puVar1 + 1;
        iVar7 = side->numsegs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar7);
  }
  return;
}

Assistant:

void FDrawInfo::AddUpperMissingTexture(side_t * side, subsector_t *sub, float Backheight)
{
	if (!side->segs[0]->backsector) return;

	totalms.Clock();
	for (int i = 0; i < side->numsegs; i++)
	{
		seg_t *seg = side->segs[i];

		// we need find the seg belonging to the passed subsector
		if (seg->Subsector == sub)
		{
			MissingTextureInfo mti = {};
			MissingSegInfo msi;


			if (sub->render_sector != sub->sector || seg->frontsector != sub->sector)
			{
				totalms.Unclock();
				return;
			}

			for (unsigned int i = 0; i < MissingUpperTextures.Size(); i++)
			{
				if (MissingUpperTextures[i].sub == sub)
				{
					// Use the lowest adjoining height to draw a fake ceiling if necessary
					if (Backheight < MissingUpperTextures[i].Planez)
					{
						MissingUpperTextures[i].Planez = Backheight;
						MissingUpperTextures[i].seg = seg;
					}

					msi.MTI_Index = i;
					msi.seg = seg;
					MissingUpperSegs.Push(msi);
					totalms.Unclock();
					return;
				}
			}
			mti.seg = seg;
			mti.sub = sub;
			mti.Planez = Backheight;
			msi.MTI_Index = MissingUpperTextures.Push(mti);
			msi.seg = seg;
			MissingUpperSegs.Push(msi);
		}
	}
	totalms.Unclock();
}